

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::DitheringCase::checkColor
          (DitheringCase *this,Vec4 *inputClr,RGBA *renderedClr,bool logErrors)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  int iVar2;
  char *__s;
  pointer piVar3;
  pointer piVar4;
  deUint32 dVar5;
  undefined8 in_RAX;
  ulong uVar6;
  size_t sVar7;
  undefined7 in_register_00000009;
  long lVar8;
  deUint32 dVar9;
  int iVar10;
  ulong uVar11;
  deUint32 dVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  float fVar16;
  vector<int,_std::allocator<int>_> channelChoices;
  IVec4 channelBits;
  vector<int,_std::allocator<int>_> local_558;
  undefined4 local_538;
  float local_534;
  Vec4 *local_530;
  ulong local_528;
  char *local_520;
  long local_518;
  char local_510;
  undefined7 uStack_50f;
  undefined4 local_4fc;
  DitheringCase *local_4f8;
  long *local_4f0;
  long local_4e0 [2];
  RGBA *local_4d0;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8 [120];
  ios_base local_430 [264];
  undefined1 local_328 [120];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_4fc = (undefined4)CONCAT71(in_register_00000009,logErrors);
  local_4b8._0_4_ = (this->m_renderFormat).redBits;
  local_4b8._4_4_ = (this->m_renderFormat).greenBits;
  uStack_4b0._0_4_ = (this->m_renderFormat).blueBits;
  uStack_4b0._4_4_ = (this->m_renderFormat).alphaBits;
  local_538 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  lVar14 = 0;
  local_530 = inputClr;
  local_4f8 = this;
  local_4d0 = renderedClr;
  do {
    iVar2 = *(int *)((long)&local_4b8 + lVar14 * 4);
    if (iVar2 != 0) {
      uVar13 = 1 << ((byte)iVar2 & 0x1f);
      dVar12 = uVar13 - 1;
      local_534 = (float)(int)dVar12 * local_530->m_data[lVar14];
      fVar16 = floorf(local_534 + 0.5);
      local_528 = CONCAT44(local_528._4_4_,fVar16);
      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      fVar16 = ceilf(local_534);
      dVar9 = (deUint32)fVar16;
      dVar5 = dVar9;
      if ((int)dVar12 < (int)dVar9) {
        dVar5 = dVar12;
      }
      if ((deUint32 *)
          local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (deUint32 *)0x0) {
        local_4a8._0_4_ = dVar5;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_558,(iterator)0x0,(int *)local_4a8);
      }
      else {
        *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = dVar5;
        local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_4a8._0_4_ = dVar9 - 1;
      if ((int)local_4a8._0_4_ < 1) {
        local_4a8._0_4_ = 0;
      }
      if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_558,
                   (iterator)
                   local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_4a8);
      }
      else {
        *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_4a8._0_4_;
        local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      fVar16 = local_534 - (float)local_528;
      uVar15 = -(uint)(-fVar16 <= fVar16);
      fVar16 = (float)(~uVar15 & (uint)-fVar16 | (uint)fVar16 & uVar15);
      local_4c8 = ZEXT416((uint)fVar16);
      if (fVar16 < 0.0001) {
        if (local_534 <= (float)local_528) {
          iVar10 = dVar9 + 1;
          local_4a8._0_4_ = iVar10;
          if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0123b919;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_558,
                     (iterator)
                     local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_4a8);
        }
        else {
          iVar10 = dVar9 - 2;
          local_4a8._0_4_ = iVar10;
          if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_558,
                       (iterator)
                       local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_4a8);
          }
          else {
LAB_0123b919:
            *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar10;
            local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      piVar4 = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar3 = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_528 = (ulong)uVar13;
      if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar6 = (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar8 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar3,piVar4);
      }
      tcu::RGBA::toIVec((RGBA *)local_4a8);
      fVar16 = floorf((float)(int)(dVar12 * *(int *)(local_4a8 + lVar14 * 4)) / 255.0 + 0.5);
      iVar10 = (int)((ulong)((long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      if (0 < iVar10) {
        lVar8 = 0;
        do {
          if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] == (int)fVar16) goto LAB_0123bd4f;
          lVar8 = lVar8 + 1;
        } while (iVar10 != (int)lVar8);
      }
      if ((char)local_4fc != '\0') {
        local_328._0_8_ = ((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_328 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failure: ",9);
        std::ostream::operator<<(poVar1,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"-bit ",5);
        __s = (char *)(&s_channelNames)[lVar14];
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," channel is ",0xc);
        std::ostream::operator<<(poVar1,(int)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", should be ",0xc);
        local_520 = &local_510;
        local_518 = 0;
        local_510 = '\0';
        uVar6 = (ulong)((long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        if (0 < (int)uVar6) {
          uVar11 = 0;
          do {
            if ((uVar11 == (int)uVar6 - 1) || (uVar11 != 0)) {
              std::__cxx11::string::append((char *)&local_520);
            }
            piVar3 = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::ostream::operator<<(local_1a8,piVar3[uVar11]);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_4f0);
            if (local_4f0 != local_4e0) {
              operator_delete(local_4f0,local_4e0[0] + 1);
            }
            uVar11 = uVar11 + 1;
            uVar6 = (ulong)((long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2;
          } while ((long)uVar11 < (long)(int)uVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_520,local_518);
        this_00 = (ostringstream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," (corresponding fragment color channel is ",0x2a);
        std::ostream::_M_insert<double>((double)local_530->m_data[lVar14]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        local_4a8._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Note: ",6);
        std::ostream::_M_insert<double>((double)local_530->m_data[lVar14]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," * (",4);
        std::ostream::operator<<(this_00,(int)local_528);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"-1) = ",6);
        std::ostream::_M_insert<double>((double)local_534);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_430);
        if (local_520 != &local_510) {
          operator_delete(local_520,CONCAT71(uStack_50f,local_510) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_2b0);
        if ((float)local_4c8._0_4_ < 0.0001) {
          local_4a8._0_8_ = ((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_4a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
                     ,0x6c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_430);
        }
      }
      local_538 = 0;
LAB_0123bd4f:
      if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == 4) {
      return (bool)((byte)local_538 & 1);
    }
  } while( true );
}

Assistant:

bool DitheringCase::checkColor (const Vec4& inputClr, const tcu::RGBA& renderedClr, const bool logErrors) const
{
	const IVec4		channelBits		= pixelFormatToIVec4(m_renderFormat);
	bool			allChannelsOk	= true;

	for (int chanNdx = 0; chanNdx < 4; chanNdx++)
	{
		if (channelBits[chanNdx] == 0)
			continue;

		const int		channelMax			= (1 << channelBits[chanNdx]) - 1;
		const float		scaledInput			= inputClr[chanNdx] * (float)channelMax;
		const bool		useRoundingMargin	= deFloatAbs(scaledInput - deFloatRound(scaledInput)) < 0.0001f;
		vector<int>		channelChoices;

		channelChoices.push_back(de::min(channelMax,	(int)deFloatCeil(scaledInput)));
		channelChoices.push_back(de::max(0,				(int)deFloatCeil(scaledInput) - 1));

		// If the input color results in a scaled value that is very close to an integer, account for a little bit of possible inaccuracy.
		if (useRoundingMargin)
		{
			if (scaledInput > deFloatRound(scaledInput))
				channelChoices.push_back((int)deFloatCeil(scaledInput) - 2);
			else
				channelChoices.push_back((int)deFloatCeil(scaledInput) + 1);
		}

		std::sort(channelChoices.begin(), channelChoices.end());

		{
			const int		renderedClrInFormat	= (int)deFloatRound((float)(renderedClr.toIVec()[chanNdx] * channelMax) / 255.0f);
			bool			goodChannel			= false;

			for (int i = 0; i < (int)channelChoices.size(); i++)
			{
				if (renderedClrInFormat == channelChoices[i])
				{
					goodChannel = true;
					break;
				}
			}

			if (!goodChannel)
			{
				if (logErrors)
				{
					m_testCtx.getLog() << TestLog::Message
									   << "Failure: " << channelBits[chanNdx] << "-bit " << s_channelNames[chanNdx] << " channel is " << renderedClrInFormat
									   << ", should be " << choiceListStr(channelChoices)
									   << " (corresponding fragment color channel is " << inputClr[chanNdx] << ")"
									   << TestLog::EndMessage
									   << TestLog::Message
									   << "Note: " << inputClr[chanNdx] << " * (" << channelMax + 1 << "-1) = " << scaledInput
									   << TestLog::EndMessage;

					if (useRoundingMargin)
					{
						m_testCtx.getLog() << TestLog::Message
										   << "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
										   << TestLog::EndMessage;
					}
				}

				allChannelsOk = false;
			}
		}
	}

	return allChannelsOk;
}